

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

DynamicType * __thiscall
Js::JavascriptLibrary::GetErrorType(JavascriptLibrary *this,ErrorTypeEnum typeToFind)

{
  DynamicType *pDVar1;
  
  switch(typeToFind) {
  case kjstError:
    pDVar1 = (this->errorType).ptr;
    break;
  case kjstEvalError:
    pDVar1 = (this->evalErrorType).ptr;
    break;
  case kjstRangeError:
    pDVar1 = (this->rangeErrorType).ptr;
    break;
  case kjstReferenceError:
    pDVar1 = (this->referenceErrorType).ptr;
    break;
  case kjstSyntaxError:
    pDVar1 = (this->syntaxErrorType).ptr;
    break;
  case kjstTypeError:
    pDVar1 = (this->typeErrorType).ptr;
    break;
  case kjstURIError:
    pDVar1 = (this->uriErrorType).ptr;
    break;
  case kjstAggregateError:
    pDVar1 = (this->aggregateErrorType).ptr;
    break;
  case kjstWebAssemblyCompileError:
    pDVar1 = (this->webAssemblyCompileErrorType).ptr;
    break;
  case kjstWebAssemblyRuntimeError:
    pDVar1 = (this->webAssemblyRuntimeErrorType).ptr;
    break;
  case kjstWebAssemblyLinkError:
    pDVar1 = (this->webAssemblyLinkErrorType).ptr;
    break;
  default:
    pDVar1 = (DynamicType *)0x0;
  }
  return pDVar1;
}

Assistant:

DynamicType* JavascriptLibrary::GetErrorType(ErrorTypeEnum typeToFind) const
    {
        switch (typeToFind)
        {
        case kjstError:
            return GetErrorType();

        case kjstEvalError:
            return GetEvalErrorType();

        case kjstRangeError:
            return GetRangeErrorType();

        case kjstReferenceError:
            return GetReferenceErrorType();

        case kjstSyntaxError:
            return GetSyntaxErrorType();

        case kjstTypeError:
            return GetTypeErrorType();

        case kjstURIError:
            return GetURIErrorType();

        case kjstAggregateError:
            return GetAggregateErrorType();

        case kjstWebAssemblyCompileError:
            return GetWebAssemblyCompileErrorType();

        case kjstWebAssemblyRuntimeError:
            return GetWebAssemblyRuntimeErrorType();

        case kjstWebAssemblyLinkError:
            return GetWebAssemblyLinkErrorType();
        }

        return nullptr;
    }